

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O0

void __thiscall nivalis::Plotter::set_curr_func(Plotter *this,size_t func_id)

{
  bool bVar1;
  deque<nivalis::color::color,_std::allocator<nivalis::color::color>_> *pdVar2;
  color *pcVar3;
  long in_RSI;
  size_t in_RDI;
  Function f;
  size_t in_stack_00000408;
  Plotter *in_stack_00000410;
  value_type *__x;
  color *in_stack_fffffffffffffde0;
  Function *this_00;
  color *this_01;
  deque<nivalis::color::color,_std::allocator<nivalis::color::color>_> *this_02;
  Function *in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe2f;
  Function local_140;
  long local_10;
  
  local_10 = in_RSI;
  if (in_RSI != *(long *)(in_RDI + 0x30)) {
    std::__cxx11::string::clear();
  }
  this_02 = *(deque<nivalis::color::color,_std::allocator<nivalis::color::color>_> **)
             (in_RDI + 0x30);
  pdVar2 = (deque<nivalis::color::color,_std::allocator<nivalis::color::color>_> *)
           std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::size
                     ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                      (in_RDI + 0x40));
  if (this_02 < pdVar2) {
    reparse_expr(in_stack_00000410,in_stack_00000408);
  }
  if (*(long *)(in_RDI + 0x30) != local_10) {
    *(long *)(in_RDI + 0x30) = local_10;
    if (*(long *)(in_RDI + 0x30) != -1) {
      *(undefined1 *)(in_RDI + 0xe0) = 1;
    }
    *(undefined1 *)(in_RDI + 0xe1) = 1;
  }
  this_01 = *(color **)(in_RDI + 0x30);
  pcVar3 = (color *)std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::size
                              ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                               (in_RDI + 0x40));
  if (this_01 == pcVar3) {
    Function::Function(in_stack_fffffffffffffe20);
    local_140.type = 0;
    bVar1 = std::deque<nivalis::color::color,_std::allocator<nivalis::color::color>_>::empty
                      ((deque<nivalis::color::color,_std::allocator<nivalis::color::color>_> *)
                       0x140a0d);
    if (bVar1) {
      *(long *)(in_RDI + 0x308) = *(long *)(in_RDI + 0x308) + 1;
      color::from_int(in_RDI);
      color::color::operator=(this_01,in_stack_fffffffffffffde0);
    }
    else {
      std::deque<nivalis::color::color,_std::allocator<nivalis::color::color>_>::front(this_02);
      color::color::operator=(this_01,in_stack_fffffffffffffde0);
      std::deque<nivalis::color::color,_std::allocator<nivalis::color::color>_>::pop_front
                ((deque<nivalis::color::color,_std::allocator<nivalis::color::color>_> *)
                 in_stack_fffffffffffffde0);
    }
    *(long *)(in_RDI + 0x338) = *(long *)(in_RDI + 0x338) + 1;
    (anonymous_namespace)::gen_func_name_abi_cxx11_
              ((bool)in_stack_fffffffffffffe2f,(size_t)in_stack_fffffffffffffe20);
    this_00 = &local_140;
    __x = (value_type *)&stack0xfffffffffffffe00;
    std::__cxx11::string::operator=((string *)this_00,(string *)__x);
    std::__cxx11::string::~string((string *)__x);
    std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::push_back
              ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)this_00,__x);
    Function::~Function(this_00);
  }
  return;
}

Assistant:

void Plotter::set_curr_func(size_t func_id) {
    if (func_id != curr_func)
        func_error.clear();
    if (curr_func < funcs.size())
        reparse_expr(curr_func);
    if (curr_func != func_id) {
        curr_func = func_id;
        if (~curr_func) focus_on_editor = true;
        require_update = true;
    }
    if (curr_func == funcs.size()) {
        // New function
        Function f;
        f.type = Function::FUNC_TYPE_EXPLICIT;
        if (reuse_colors.empty()) {
            f.line_color =
                color::from_int(last_expr_color++);
        } else {
            f.line_color = reuse_colors.front();
            reuse_colors.pop_front();
        }
        f.name = gen_func_name(use_latex, next_func_name++);
        funcs.push_back(std::move(f));
    }
}